

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void dummy_LdImportMeta(void)

{
  return;
}

Assistant:

void JavascriptOperators::OP_InitClassMemberSetComputedName(Var object, Var elementName, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_InitClassMemberSetComputedName);
        Js::PropertyId propertyId = JavascriptOperators::OP_InitElemSetter(object, elementName, value, scriptContext);
        RecyclableObject* instance = VarTo<RecyclableObject>(object);

        // instance will be a function if it is the class constructor (otherwise it would be an object)
        if (VarIs<JavascriptFunction>(instance) && Js::PropertyIds::prototype == propertyId)
        {
            // It is a TypeError to have a static member with a computed name that evaluates to 'prototype'
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassStaticMethodCannotBePrototype);
        }

        instance->SetAttributes(propertyId, PropertyClassMemberDefaults);
        JIT_HELPER_END(Op_InitClassMemberSetComputedName);
    }